

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_15x15(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  int aiStack_218 [122];
  
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  for (lVar26 = 0; (int)lVar26 != 8; lVar26 = lVar26 + 1) {
    lVar23 = (long)*(short *)((long)pvVar3 + lVar26 * 2) * (long)coef_block[lVar26] * 0x2000;
    lVar28 = (long)*(short *)((long)pvVar3 + lVar26 * 2 + 0x20) * (long)coef_block[lVar26 + 0x10];
    lVar10 = (long)*(short *)((long)pvVar3 + lVar26 * 2 + 0x40) * (long)coef_block[lVar26 + 0x20];
    lVar32 = (long)*(short *)((long)pvVar3 + lVar26 * 2 + 0x60) * (long)coef_block[lVar26 + 0x30];
    lVar15 = lVar32 * -0xdfc + lVar23 + 0x400;
    lVar19 = lVar32 * 0x249d + lVar23 + 0x400;
    lVar23 = lVar32 * -0x2d42 + lVar23 + 0x400;
    lVar40 = lVar28 - lVar10;
    lVar10 = lVar10 + lVar28;
    lVar33 = lVar40 * 0x176 + lVar10 * 0x2ace + lVar19;
    lVar42 = lVar40 * 0x176 + lVar15 + lVar28 * 0x2e13 + lVar10 * -0x2ace;
    lVar38 = lVar40 * -0xcc7 + lVar10 * -0x1182 + lVar19;
    lVar35 = lVar40 * -0xcc7 + lVar15 + lVar10 * 0x1182 + lVar28 * -0x2e13;
    lVar15 = lVar40 * 0xb50 + lVar10 * 0x194c + lVar15;
    lVar20 = lVar19 + lVar10 * -0x194c + lVar40 * 0xb50;
    lVar37 = lVar40 * 0x16a0 + lVar23;
    lVar32 = (long)*(short *)((long)pvVar3 + lVar26 * 2 + 0x10) * (long)coef_block[lVar26 + 8];
    lVar11 = (long)*(short *)((long)pvVar3 + lVar26 * 2 + 0x30) * (long)coef_block[lVar26 + 0x18];
    lVar34 = (long)*(short *)((long)pvVar3 + lVar26 * 2 + 0x50) * (long)coef_block[lVar26 + 0x28];
    lVar16 = (long)*(short *)((long)pvVar3 + lVar26 * 2 + 0x70) * (long)coef_block[lVar26 + 0x38];
    lVar19 = ((lVar11 - lVar16) + lVar32) * 0x1a9a;
    lVar10 = lVar32 * 0x1071 + lVar19;
    lVar19 = (lVar11 - lVar16) * -0x45a4 + lVar19;
    lVar28 = (lVar32 - lVar16) * 0x2d02 + lVar34 * 0x2731;
    lVar12 = lVar16 * 0x4ea3 + lVar11 * 0x2b0a + lVar28;
    lVar28 = lVar32 * -0x2399 + lVar11 * -0x1a9a + lVar28;
    lVar29 = (lVar32 - lVar16) - lVar34;
    lVar17 = (lVar32 + lVar16) * 0x1268;
    lVar32 = lVar32 * 0xf39 + lVar11 * -0x1a9a + lVar34 * -0x2731 + lVar17;
    lVar17 = lVar34 * 0x2731 + lVar11 * -0x2b0a + lVar16 * -0x1bd1 + lVar17;
    aiStack_218[lVar26] = (int)((ulong)(lVar12 + lVar33) >> 0xb);
    aiStack_218[lVar26 + 0x70] = (int)((ulong)(lVar33 - lVar12) >> 0xb);
    aiStack_218[lVar26 + 8] = (int)((ulong)(lVar10 + lVar15) >> 0xb);
    aiStack_218[lVar26 + 0x68] = (int)((ulong)(lVar15 - lVar10) >> 0xb);
    aiStack_218[lVar26 + 0x10] = (int)((ulong)(lVar29 * 0x2731 + lVar37) >> 0xb);
    aiStack_218[lVar26 + 0x60] = (int)((ulong)(lVar37 + lVar29 * -0x2731) >> 0xb);
    aiStack_218[lVar26 + 0x18] = (int)((ulong)(lVar32 + lVar42) >> 0xb);
    aiStack_218[lVar26 + 0x58] = (int)((ulong)(lVar42 - lVar32) >> 0xb);
    aiStack_218[lVar26 + 0x20] = (int)((ulong)(lVar19 + lVar20) >> 0xb);
    aiStack_218[lVar26 + 0x50] = (int)((ulong)(lVar20 - lVar19) >> 0xb);
    aiStack_218[lVar26 + 0x28] = (int)((ulong)(lVar38 + lVar17) >> 0xb);
    aiStack_218[lVar26 + 0x48] = (int)((ulong)(lVar38 - lVar17) >> 0xb);
    aiStack_218[lVar26 + 0x30] = (int)((ulong)(lVar35 + lVar28) >> 0xb);
    aiStack_218[lVar26 + 0x40] = (int)((ulong)(lVar35 - lVar28) >> 0xb);
    aiStack_218[lVar26 + 0x38] = (int)((ulong)(lVar40 * 0x7ffffffd2c0 + lVar23) >> 0xb);
  }
  uVar8 = (ulong)output_col;
  for (lVar26 = 0; lVar26 != 0x78; lVar26 = lVar26 + 8) {
    iVar25 = aiStack_218[lVar26 + 1];
    iVar4 = aiStack_218[lVar26] * 0x2000;
    iVar1 = aiStack_218[lVar26 + 2];
    iVar24 = aiStack_218[lVar26 + 6];
    iVar21 = iVar24 * -0xdfc + iVar4 + 0x20000;
    iVar30 = iVar24 * 0x249d + iVar4 + 0x20000;
    iVar5 = iVar4 + iVar24 * -0x2d42 + 0x20000;
    iVar13 = iVar1 - aiStack_218[lVar26 + 4];
    iVar24 = aiStack_218[lVar26 + 4] + iVar1;
    iVar39 = iVar13 * 0x176 + iVar24 * 0x2ace + iVar30;
    iVar36 = iVar13 * 0x176 + iVar21 + iVar1 * 0x2e13 + iVar24 * -0x2ace;
    iVar27 = iVar13 * -0xcc7 + iVar24 * -0x1182 + iVar30;
    iVar41 = iVar13 * -0xcc7 + iVar21 + iVar24 * 0x1182 + iVar1 * -0x2e13;
    iVar21 = iVar13 * 0xb50 + iVar24 * 0x194c + iVar21;
    iVar31 = iVar30 + iVar24 * -0x194c + iVar13 * 0xb50;
    iVar9 = iVar13 * 0x16a0 + iVar5;
    iVar1 = aiStack_218[lVar26 + 3];
    iVar24 = aiStack_218[lVar26 + 7];
    iVar30 = ((iVar1 - iVar24) + iVar25) * 0x1a9a;
    iVar22 = iVar25 * 0x1071 + iVar30;
    iVar30 = (iVar1 - iVar24) * -0x45a4 + iVar30;
    iVar4 = aiStack_218[lVar26 + 5];
    iVar6 = (iVar25 - iVar24) * 0x2d02 + iVar4 * 0x2731;
    iVar14 = iVar24 * 0x4ea3 + iVar1 * 0x2b0a + iVar6;
    iVar6 = iVar25 * -0x2399 + iVar1 * -0x1a9a + iVar6;
    iVar18 = (iVar25 - iVar24) - iVar4;
    iVar7 = (iVar24 + iVar25) * 0x1268;
    iVar25 = iVar25 * 0xf39 + iVar1 * -0x1a9a + iVar4 * -0x2731 + iVar7;
    iVar7 = iVar4 * 0x2731 + iVar1 * -0x2b0a + iVar24 * -0x1bd1 + iVar7;
    lVar23 = *(long *)((long)output_buf + lVar26);
    *(JSAMPLE *)(lVar23 + uVar8) = pJVar2[(ulong)((uint)(iVar14 + iVar39) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 0xe + uVar8) =
         pJVar2[(ulong)((uint)(iVar39 - iVar14) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 1 + uVar8) =
         pJVar2[(ulong)((uint)(iVar22 + iVar21) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 0xd + uVar8) =
         pJVar2[(ulong)((uint)(iVar21 - iVar22) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 2 + uVar8) =
         pJVar2[(ulong)((uint)(iVar18 * 0x2731 + iVar9) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 0xc + uVar8) =
         pJVar2[(ulong)((uint)(iVar9 + iVar18 * -0x2731) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 3 + uVar8) =
         pJVar2[(ulong)((uint)(iVar25 + iVar36) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 0xb + uVar8) =
         pJVar2[(ulong)((uint)(iVar36 - iVar25) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 4 + uVar8) =
         pJVar2[(ulong)((uint)(iVar30 + iVar31) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 10 + uVar8) =
         pJVar2[(ulong)((uint)(iVar31 - iVar30) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 5 + uVar8) =
         pJVar2[(ulong)((uint)(iVar27 + iVar7) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 9 + uVar8) =
         pJVar2[(ulong)((uint)(iVar27 - iVar7) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 6 + uVar8) =
         pJVar2[(ulong)((uint)(iVar6 + iVar41) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 8 + uVar8) =
         pJVar2[(ulong)((uint)(iVar41 - iVar6) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar23 + 7 + uVar8) =
         pJVar2[(ulong)((uint)(iVar13 * 0xfffd2c0 + iVar5) >> 0x12 & 0x3ff) + 0x80];
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_15x15(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26, tmp27;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 15];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp10 = MULTIPLY(z4, FIX(0.437016024)); /* c12 */
    tmp11 = MULTIPLY(z4, FIX(1.144122806)); /* c6 */

    tmp12 = z1 - tmp10;
    tmp13 = z1 + tmp11;
    z1 -= LEFT_SHIFT(tmp11 - tmp10, 1);     /* c0 = (c6-c12)*2 */

    z4 = z2 - z3;
    z3 += z2;
    tmp10 = MULTIPLY(z3, FIX(1.337628990)); /* (c2+c4)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.045680613)); /* (c2-c4)/2 */
    z2 = MULTIPLY(z2, FIX(1.439773946));    /* c4+c14 */

    tmp20 = tmp13 + tmp10 + tmp11;
    tmp23 = tmp12 - tmp10 + tmp11 + z2;

    tmp10 = MULTIPLY(z3, FIX(0.547059574)); /* (c8+c14)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.399234004)); /* (c8-c14)/2 */

    tmp25 = tmp13 - tmp10 - tmp11;
    tmp26 = tmp12 + tmp10 - tmp11 - z2;

    tmp10 = MULTIPLY(z3, FIX(0.790569415)); /* (c6+c12)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.353553391)); /* (c6-c12)/2 */

    tmp21 = tmp12 + tmp10 + tmp11;
    tmp24 = tmp13 - tmp10 + tmp11;
    tmp11 += tmp11;
    tmp22 = z1 + tmp11;                     /* c10 = c6-c12 */
    tmp27 = z1 - tmp11 - tmp11;             /* c0 = (c6-c12)*2 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z3 = MULTIPLY(z4, FIX(1.224744871));                    /* c5 */
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp13 = z2 - z4;
    tmp15 = MULTIPLY(z1 + tmp13, FIX(0.831253876));         /* c9 */
    tmp11 = tmp15 + MULTIPLY(z1, FIX(0.513743148));         /* c3-c9 */
    tmp14 = tmp15 - MULTIPLY(tmp13, FIX(2.176250899));      /* c3+c9 */

    tmp13 = MULTIPLY(z2, -FIX(0.831253876));                /* -c9 */
    tmp15 = MULTIPLY(z2, -FIX(1.344997024));                /* -c3 */
    z2 = z1 - z4;
    tmp12 = z3 + MULTIPLY(z2, FIX(1.406466353));            /* c1 */

    tmp10 = tmp12 + MULTIPLY(z4, FIX(2.457431844)) - tmp15; /* c1+c7 */
    tmp16 = tmp12 - MULTIPLY(z1, FIX(1.112434820)) + tmp13; /* c1-c13 */
    tmp12 = MULTIPLY(z2, FIX(1.224744871)) - z3;            /* c5 */
    z2 = MULTIPLY(z1 + z4, FIX(0.575212477));               /* c11 */
    tmp13 += z2 + MULTIPLY(z1, FIX(0.475753014)) - z3;      /* c7-c11 */
    tmp15 += z2 - MULTIPLY(z4, FIX(0.869244010)) + z3;      /* c11+c13 */

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 14] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 13] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 12] = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp26 + tmp16, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp26 - tmp16, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp27, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 15 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 15; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z1 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z1 = LEFT_SHIFT(z1, CONST_BITS);

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[4];
    z4 = (JLONG)wsptr[6];

    tmp10 = MULTIPLY(z4, FIX(0.437016024)); /* c12 */
    tmp11 = MULTIPLY(z4, FIX(1.144122806)); /* c6 */

    tmp12 = z1 - tmp10;
    tmp13 = z1 + tmp11;
    z1 -= LEFT_SHIFT(tmp11 - tmp10, 1);     /* c0 = (c6-c12)*2 */

    z4 = z2 - z3;
    z3 += z2;
    tmp10 = MULTIPLY(z3, FIX(1.337628990)); /* (c2+c4)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.045680613)); /* (c2-c4)/2 */
    z2 = MULTIPLY(z2, FIX(1.439773946));    /* c4+c14 */

    tmp20 = tmp13 + tmp10 + tmp11;
    tmp23 = tmp12 - tmp10 + tmp11 + z2;

    tmp10 = MULTIPLY(z3, FIX(0.547059574)); /* (c8+c14)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.399234004)); /* (c8-c14)/2 */

    tmp25 = tmp13 - tmp10 - tmp11;
    tmp26 = tmp12 + tmp10 - tmp11 - z2;

    tmp10 = MULTIPLY(z3, FIX(0.790569415)); /* (c6+c12)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.353553391)); /* (c6-c12)/2 */

    tmp21 = tmp12 + tmp10 + tmp11;
    tmp24 = tmp13 - tmp10 + tmp11;
    tmp11 += tmp11;
    tmp22 = z1 + tmp11;                     /* c10 = c6-c12 */
    tmp27 = z1 - tmp11 - tmp11;             /* c0 = (c6-c12)*2 */

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z4 = (JLONG)wsptr[5];
    z3 = MULTIPLY(z4, FIX(1.224744871));                    /* c5 */
    z4 = (JLONG)wsptr[7];

    tmp13 = z2 - z4;
    tmp15 = MULTIPLY(z1 + tmp13, FIX(0.831253876));         /* c9 */
    tmp11 = tmp15 + MULTIPLY(z1, FIX(0.513743148));         /* c3-c9 */
    tmp14 = tmp15 - MULTIPLY(tmp13, FIX(2.176250899));      /* c3+c9 */

    tmp13 = MULTIPLY(z2, -FIX(0.831253876));                /* -c9 */
    tmp15 = MULTIPLY(z2, -FIX(1.344997024));                /* -c3 */
    z2 = z1 - z4;
    tmp12 = z3 + MULTIPLY(z2, FIX(1.406466353));            /* c1 */

    tmp10 = tmp12 + MULTIPLY(z4, FIX(2.457431844)) - tmp15; /* c1+c7 */
    tmp16 = tmp12 - MULTIPLY(z1, FIX(1.112434820)) + tmp13; /* c1-c13 */
    tmp12 = MULTIPLY(z2, FIX(1.224744871)) - z3;            /* c5 */
    z2 = MULTIPLY(z1 + z4, FIX(0.575212477));               /* c11 */
    tmp13 += z2 + MULTIPLY(z1, FIX(0.475753014)) - z3;      /* c7-c11 */
    tmp15 += z2 - MULTIPLY(z4, FIX(0.869244010)) + z3;      /* c11+c13 */

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[14] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[13] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[12] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp26 + tmp16,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp26 - tmp16,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp27,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}